

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::buildValidSubstitutionListF
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          SchemaElementDecl *subsElemDecl)

{
  uint key2;
  QName *pQVar1;
  XMLCh *key1;
  XMLSize_t XVar2;
  SchemaElementDecl *elemDecl_00;
  ulong uVar3;
  XMLSize_t XVar4;
  GrammarResolver *this_00;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *this_01;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *this_02;
  SchemaElementDecl **ppSVar8;
  undefined4 extraout_var;
  Grammar *pGVar9;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *toCopy;
  XMLSize_t getAt;
  ulong uVar10;
  
  pQVar1 = (elemDecl->super_XMLElementDecl).fElementName;
  this_01 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
            ::get(this->fValidSubstitutionGroups,pQVar1->fLocalPart,pQVar1->fURIId);
  if (this_01 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
    return;
  }
  pQVar1 = (subsElemDecl->super_XMLElementDecl).fElementName;
  key2 = pQVar1->fURIId;
  key1 = pQVar1->fLocalPart;
  this_02 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
            ::get(this->fValidSubstitutionGroups,key1,key2);
  if (this_02 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
    if (this->fTargetNSURI == key2) {
      return;
    }
    this_00 = this->fGrammarResolver;
    iVar7 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                      (this->fURIStringPool,(ulong)key2);
    pGVar9 = GrammarResolver::getGrammar(this_00,(XMLCh *)CONCAT44(extraout_var,iVar7));
    if (pGVar9 == (Grammar *)0x0) {
      return;
    }
    toCopy = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                    *)pGVar9[10].super_XSerializable._vptr_XSerializable,key1,key2);
    if (toCopy == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
      return;
    }
    this_02 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
              XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
    ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf(this_02,toCopy);
    RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
    ::put(this->fValidSubstitutionGroups,key1,key2,this_02);
  }
  XVar2 = this_01->fCurCount;
  if (XVar2 != 0) {
    getAt = 0;
    do {
      ppSVar8 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::elementAt(this_01,getAt);
      elemDecl_00 = *ppSVar8;
      uVar3 = this_02->fCurCount;
      if (uVar3 == 0) {
LAB_003335e1:
        bVar6 = isSubstitutionGroupValid
                          (this,elem,subsElemDecl,elemDecl_00->fComplexTypeInfo,
                           elemDecl_00->fDatatypeValidator,(XMLCh *)0x0,false);
        if (bVar6) {
          ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(this_02,1);
          XVar4 = this_02->fCurCount;
          this_02->fCurCount = XVar4 + 1;
          this_02->fElemList[XVar4] = elemDecl_00;
          buildValidSubstitutionListB(this,elem,elemDecl_00,subsElemDecl);
        }
      }
      else if (*this_02->fElemList != elemDecl_00) {
        uVar5 = 1;
        do {
          uVar10 = uVar5;
          if (uVar3 == uVar10) break;
          uVar5 = uVar10 + 1;
        } while (this_02->fElemList[uVar10] != elemDecl_00);
        if (uVar3 <= uVar10) goto LAB_003335e1;
      }
      getAt = getAt + 1;
    } while (getAt != XVar2);
  }
  return;
}

Assistant:

void
TraverseSchema::buildValidSubstitutionListF(const DOMElement* const elem,
                                            SchemaElementDecl* const elemDecl,
                                            SchemaElementDecl* const subsElemDecl) {

    int elemURI = elemDecl->getURI();
    XMLCh* elemName = elemDecl->getBaseName();
    ValueVectorOf<SchemaElementDecl*>* validSubsElements =fValidSubstitutionGroups->get(elemName, elemURI);

    if (validSubsElements) {

        int subsElemURI = subsElemDecl->getURI();
        XMLCh* subsElemName = subsElemDecl->getBaseName();
        ValueVectorOf<SchemaElementDecl*>* validSubs = fValidSubstitutionGroups->get(subsElemName, subsElemURI);

        if (!validSubs) {

            if (fTargetNSURI == subsElemURI) {
                return; // an error must have occured
            }

            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(subsElemURI));

            if (!aGrammar)
                return;

            validSubs = aGrammar->getValidSubstitutionGroups()->get(subsElemName, subsElemURI);

            if (!validSubs) {
                return;
            }

            validSubs = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*validSubs);
            fValidSubstitutionGroups->put((void*) subsElemName, subsElemURI, validSubs);
        }

        XMLSize_t elemSize = validSubsElements->size();
        for (XMLSize_t i=0; i<elemSize; i++) {

            SchemaElementDecl* chainElem = validSubsElements->elementAt(i);

            if (validSubs->containsElement(chainElem)) {
                continue;
            }

            if (isSubstitutionGroupValid(elem, subsElemDecl, chainElem->getComplexTypeInfo(),
                                         chainElem->getDatatypeValidator(), 0, false)) {
                validSubs->addElement(chainElem);
                buildValidSubstitutionListB(elem, chainElem, subsElemDecl);
            }
        }
    }
}